

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lysp_resolve_ext_instance_records(lysp_ctx *pctx)

{
  LY_ERR LVar1;
  lyplg_ext_record *plVar2;
  lysp_ext_instance *local_e0;
  lysp_ext_instance *local_c8;
  lysp_ext_instance *local_b8;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  lysp_ext_instance *local_98;
  lysp_ext_instance *local_88;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *path;
  uint64_t u;
  lys_module *plStack_58;
  uint32_t i;
  lys_module *mod;
  lysp_ext_instance *ext;
  lysp_ext_instance *exts;
  lysf_ctx fctx;
  LY_ERR r;
  lysp_ctx *pctx_local;
  
  memset(&exts,0,0x20);
  if (pctx == (lysp_ctx *)0x0) {
    local_88 = (lysp_ext_instance *)0x0;
  }
  else {
    local_88 = (lysp_ext_instance *)
               **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  exts = local_88;
  _ret___1 = (char *)0x0;
  for (u._4_4_ = 0; u._4_4_ < (pctx->ext_inst).count; u._4_4_ = u._4_4_ + 1) {
    ext = (lysp_ext_instance *)(pctx->ext_inst).field_2.dnodes[u._4_4_];
    path = (char *)0x0;
    while( true ) {
      if (ext == (lysp_ext_instance *)0x0) {
        local_98 = (lysp_ext_instance *)0x0;
      }
      else {
        local_98 = ext[-1].exts;
      }
      if (local_98 <= path) break;
      mod = (lys_module *)(ext + (long)path);
      if (pctx == (lysp_ctx *)0x0) {
        local_a0 = (ly_ctx *)0x0;
      }
      else {
        local_a0 = (ly_ctx *)
                   **(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
      }
      LVar1 = lysp_ext_find_definition
                        (local_a0,(lysp_ext_instance *)mod,&stack0xffffffffffffffa8,
                         (lysp_ext **)&mod->prefix);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      if (pctx == (lysp_ctx *)0x0) {
        local_a8 = (ly_ctx *)0x0;
      }
      else {
        local_a8 = (ly_ctx *)
                   **(undefined8 **)
                     (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
      }
      LVar1 = lysp_ext_instance_resolve_argument(local_a8,(lysp_ext_instance *)mod);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      plVar2 = lyplg_ext_record_find
                         (plStack_58->ctx,plStack_58->name,plStack_58->revision,
                          *(char **)mod->prefix);
      mod->ref = (char *)plVar2;
      path = path + 1;
    }
  }
  u._4_4_ = 0;
  do {
    if ((pctx->ext_inst).count <= u._4_4_) {
      return LY_SUCCESS;
    }
    ext = (lysp_ext_instance *)(pctx->ext_inst).field_2.dnodes[u._4_4_];
    path = (char *)0x0;
    while( true ) {
      if (ext == (lysp_ext_instance *)0x0) {
        local_b8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_b8 = ext[-1].exts;
      }
      if (local_b8 <= path) break;
      mod = (lys_module *)(ext + (long)path);
      if (((lyplg_ext_record *)mod->ref == (lyplg_ext_record *)0x0) ||
         ((((lyplg_ext_record *)mod->ref)->plugin).parse == (lyplg_ext_parse_clb)0x0)) {
LAB_00193462:
        path = path + 1;
      }
      else {
        fctx.ext_set.field_2._4_4_ =
             lysp_resolve_ext_instance_log_path(pctx,(lysp_ext_instance *)mod,(char **)&ret___1);
        if (fctx.ext_set.field_2._4_4_ != LY_SUCCESS) {
          return fctx.ext_set.field_2._4_4_;
        }
        ly_log_location((lysc_node *)0x0,(lyd_node *)0x0,_ret___1,(ly_in *)0x0);
        fctx.ext_set.field_2._4_4_ = (**(code **)(mod->ref + 0x20))(pctx,mod);
        ly_log_location_revert(0,0,1,0);
        free(_ret___1);
        if (fctx.ext_set.field_2._4_4_ != 0xb) {
          if (fctx.ext_set.field_2._4_4_ != 0) {
            return fctx.ext_set.field_2._4_4_;
          }
          goto LAB_00193462;
        }
        lysp_ext_instance_free((lysf_ctx *)&exts,(lysp_ext_instance *)mod);
        ext[-1].exts = (lysp_ext_instance *)((long)&ext[-1].exts[-1].exts + 7);
        if (ext == (lysp_ext_instance *)0x0) {
          local_c8 = (lysp_ext_instance *)0x0;
        }
        else {
          local_c8 = ext[-1].exts;
        }
        if (path < local_c8) {
          if (ext == (lysp_ext_instance *)0x0) {
            local_e0 = (lysp_ext_instance *)0x0;
          }
          else {
            local_e0 = ext[-1].exts;
          }
          memcpy(mod,ext + (long)local_e0,0x70);
        }
      }
    }
    u._4_4_ = u._4_4_ + 1;
  } while( true );
}

Assistant:

static LY_ERR
lysp_resolve_ext_instance_records(struct lysp_ctx *pctx)
{
    LY_ERR r;
    struct lysf_ctx fctx = {.ctx = PARSER_CTX(pctx)};
    struct lysp_ext_instance *exts, *ext;
    const struct lys_module *mod;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;
    char *path = NULL;

    /* first finish parsing all extension instances ... */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        LY_ARRAY_FOR(exts, u) {
            ext = &exts[u];

            /* find the extension definition */
            LY_CHECK_RET(lysp_ext_find_definition(PARSER_CTX(pctx), ext, &mod, &ext->def));

            /* resolve the argument, if needed */
            LY_CHECK_RET(lysp_ext_instance_resolve_argument(PARSER_CTX(pctx), ext));

            /* find the extension record, if any */
            ext->record = lyplg_ext_record_find(mod->ctx, mod->name, mod->revision, ext->def->name);
        }
    }

    /* ... then call the parse callback */
    for (i = 0; i < pctx->ext_inst.count; ++i) {
        exts = pctx->ext_inst.objs[i];
        u = 0;
        while (u < LY_ARRAY_COUNT(exts)) {
            ext = &exts[u];
            if (!ext->record || !ext->record->plugin.parse) {
                goto next_iter;
            }

            /* set up log path */
            if ((r = lysp_resolve_ext_instance_log_path(pctx, ext, &path))) {
                return r;
            }
            ly_log_location(NULL, NULL, path, NULL);

            /* parse */
            r = ext->record->plugin.parse(pctx, ext);

            ly_log_location_revert(0, 0, 1, 0);
            free(path);

            if (r == LY_ENOT) {
                /* instance should be ignored, remove it */
                lysp_ext_instance_free(&fctx, ext);
                LY_ARRAY_DECREMENT(exts);
                if (u < LY_ARRAY_COUNT(exts)) {
                    /* replace by the last item */
                    *ext = exts[LY_ARRAY_COUNT(exts)];
                } /* else if there are no more items, leave the empty array, we are not able to free it */
                continue;
            } else if (r) {
                /* error */
                return r;
            }

next_iter:
            ++u;
        }
    }

    return LY_SUCCESS;
}